

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

LispPTR get_fn_fvar_name(fnhead *fnobj,DLword offset)

{
  DLword *pDVar1;
  undefined6 in_register_00000032;
  
  for (pDVar1 = (DLword *)(&fnobj->na + (byte)fnobj->field_0xc);
      *(uint *)(pDVar1 + fnobj->ntsize) !=
      ((uint)CONCAT62(in_register_00000032,offset) | 0xc0000000); pDVar1 = pDVar1 + 2) {
  }
  return *(LispPTR *)pDVar1;
}

Assistant:

LispPTR get_fn_fvar_name(struct fnhead *fnobj, DLword offset) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;

  first_table = (NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset);
  second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);
#ifdef BIGATOMS
  while (*(second_table) != (VTY_FVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_FVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
#ifdef BIGATOMS
  return ((LispPTR) * (first_table));
#else
  return ((LispPTR)GETWORD(first_table));
#endif /* BIGATOMS */

}